

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UBool __thiscall icu_63::RuleBasedCollator::operator==(RuleBasedCollator *this,Collator *other)

{
  CollationData *pCVar1;
  CollationData *pCVar2;
  UBool UVar3;
  int iVar4;
  undefined4 extraout_var;
  UnicodeSet *pUVar5;
  UnicodeSet *p;
  bool bVar6;
  LocalPointer<icu_63::UnicodeSet> thisTailored;
  UErrorCode errorCode;
  LocalPointer<icu_63::UnicodeSet> otherTailored;
  int local_24;
  UnicodeSet *local_20;
  UnicodeSet *this_00;
  undefined4 extraout_var_00;
  
  if (this == (RuleBasedCollator *)other) {
    return '\x01';
  }
  UVar3 = Collator::operator==(&this->super_Collator,other);
  if ((UVar3 != '\0') &&
     (UVar3 = CollationSettings::operator==
                        (this->settings,(CollationSettings *)other[2].super_UObject._vptr_UObject),
     UVar3 != '\0')) {
    pCVar1 = (CollationData *)other[1].super_UObject._vptr_UObject;
    if (this->data == pCVar1) {
      return '\x01';
    }
    pCVar2 = this->data->base;
    pCVar1 = pCVar1->base;
    if ((pCVar1 == (CollationData *)0x0) == (pCVar2 == (CollationData *)0x0)) {
      if ((((pCVar2 == (CollationData *)0x0) ||
           (0x1f < (ushort)(this->tailoring->rules).fUnion.fStackFields.fLengthAndFlags)) &&
          ((pCVar1 == (CollationData *)0x0 ||
           (0x1f < *(ushort *)(other[3].super_UObject._vptr_UObject + 6))))) &&
         (UVar3 = UnicodeString::operator==
                            (&this->tailoring->rules,
                             (UnicodeString *)(other[3].super_UObject._vptr_UObject + 5)),
         UVar3 != '\0')) {
        return '\x01';
      }
      p = (UnicodeSet *)&stack0xffffffffffffffdc;
      local_24 = 0;
      iVar4 = (*(this->super_Collator).super_UObject._vptr_UObject[0x1f])(this,p);
      this_00 = (UnicodeSet *)CONCAT44(extraout_var,iVar4);
      iVar4 = (*(other->super_UObject)._vptr_UObject[0x1f])(other);
      pUVar5 = (UnicodeSet *)CONCAT44(extraout_var_00,iVar4);
      local_20 = pUVar5;
      if (local_24 < 1) {
        UVar3 = UnicodeSet::operator==(this_00,pUVar5);
        bVar6 = UVar3 != '\0';
        p = pUVar5;
      }
      else {
        bVar6 = false;
      }
      pUVar5 = local_20;
      if (local_20 != (UnicodeSet *)0x0) {
        UnicodeSet::~UnicodeSet(local_20);
        UMemory::operator_delete((UMemory *)pUVar5,p);
      }
      if (this_00 == (UnicodeSet *)0x0) {
        return bVar6;
      }
      UnicodeSet::~UnicodeSet(this_00);
      UMemory::operator_delete((UMemory *)this_00,p);
      return bVar6;
    }
  }
  return '\0';
}

Assistant:

UBool
RuleBasedCollator::operator==(const Collator& other) const {
    if(this == &other) { return TRUE; }
    if(!Collator::operator==(other)) { return FALSE; }
    const RuleBasedCollator &o = static_cast<const RuleBasedCollator &>(other);
    if(*settings != *o.settings) { return FALSE; }
    if(data == o.data) { return TRUE; }
    UBool thisIsRoot = data->base == NULL;
    UBool otherIsRoot = o.data->base == NULL;
    U_ASSERT(!thisIsRoot || !otherIsRoot);  // otherwise their data pointers should be ==
    if(thisIsRoot != otherIsRoot) { return FALSE; }
    if((thisIsRoot || !tailoring->rules.isEmpty()) &&
            (otherIsRoot || !o.tailoring->rules.isEmpty())) {
        // Shortcut: If both collators have valid rule strings, then compare those.
        if(tailoring->rules == o.tailoring->rules) { return TRUE; }
    }
    // Different rule strings can result in the same or equivalent tailoring.
    // The rule strings are optional in ICU resource bundles, although included by default.
    // cloneBinary() drops the rule string.
    UErrorCode errorCode = U_ZERO_ERROR;
    LocalPointer<UnicodeSet> thisTailored(getTailoredSet(errorCode));
    LocalPointer<UnicodeSet> otherTailored(o.getTailoredSet(errorCode));
    if(U_FAILURE(errorCode)) { return FALSE; }
    if(*thisTailored != *otherTailored) { return FALSE; }
    // For completeness, we should compare all of the mappings;
    // or we should create a list of strings, sort it with one collator,
    // and check if both collators compare adjacent strings the same
    // (order & strength, down to quaternary); or similar.
    // Testing equality of collators seems unusual.
    return TRUE;
}